

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void __thiscall trun::Process::Process(Process *this,string *use_command)

{
  string *use_command_local;
  Process *this_local;
  
  ProcessCallbackBase::ProcessCallbackBase(&this->super_ProcessCallbackBase);
  (this->super_ProcessCallbackBase).super_ProcessCallbackInterface._vptr_ProcessCallbackInterface =
       (_func_int **)&PTR_OnProcessStarted_003c7ad8;
  std::__cxx11::string::string((string *)&this->command);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->arguments);
  Process_Unix::Process_Unix(&this->process);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->command,use_command);
  this->callback = (ProcessCallbackInterface *)0x0;
  return;
}

Assistant:

Process::Process(std::string use_command) {
	command = use_command;
	callback = nullptr;
}